

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O3

void tlx::die_with_message(string *msg)

{
  DieException *this;
  ostream *poVar1;
  
  if ((s_die_with_exception & 1) != 0) {
    this = (DieException *)__cxa_allocate_exception(0x10);
    DieException::DieException(this,msg);
    __cxa_throw(this,&DieException::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)msg);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::terminate();
}

Assistant:

void die_with_message(const std::string& msg) {
    if (s_die_with_exception) {
        throw DieException(msg);
    }
    else {
        std::cerr << msg << std::endl;
        std::terminate();
    }
}